

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_ezf(char *hash,char *fmt,...)

{
  char in_AL;
  char *__s;
  size_t in_XMM5_Qb;
  char *in_XMM6_Qa;
  char *in_XMM6_Qb;
  char *src;
  va_list args;
  __va_list_tag *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffffa0 = in_XMM5_Qb;
    in_stack_ffffffffffffffa8 = in_XMM6_Qa;
    in_stack_ffffffffffffffb0 = in_XMM6_Qb;
  }
  __s = t3vsprintf_alloc(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  strlen(__s);
  sha256_ez(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  free(__s);
  return;
}

Assistant:

void sha256_ezf(char *hash, const char *fmt, ...)
{
    /* generate the hash source */
    va_list args;
    va_start(args, fmt);
    char *src = t3vsprintf_alloc(fmt, args);
    va_end(args);

    /* hash the result */
    sha256_ez(hash, src, strlen(src));

    /* done with the source buffer */
    t3free(src);
}